

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-type.c
# Opt level: O1

int coda_cdf_variable_add_attribute
              (coda_cdf_variable *type,char *real_name,coda_dynamic_type *attribute_type,
              int update_definition)

{
  int iVar1;
  coda_type_record *pcVar2;
  coda_mem_record *pcVar3;
  long lVar4;
  coda_dynamic_type **ppcVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  
  if (type == (coda_cdf_variable *)0x0) {
    pcVar7 = "type argument is NULL (%s:%u)";
    uVar8 = 0x1ac;
LAB_00121c31:
    coda_set_error(-100,pcVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,uVar8);
    return -1;
  }
  if (real_name == (char *)0x0) {
    pcVar7 = "real_name argument is NULL (%s:%u)";
    uVar8 = 0x1b1;
    goto LAB_00121c31;
  }
  if (attribute_type == (coda_dynamic_type *)0x0) {
    pcVar7 = "attribute_type argument is NULL (%s:%u)";
    uVar8 = 0x1b6;
    goto LAB_00121c31;
  }
  pcVar3 = type->attributes;
  if (pcVar3 == (coda_mem_record *)0x0) {
    if (update_definition == 0) {
      pcVar7 = "type does not have an attribute with name \'%s\' (%s:%u)";
      iVar1 = -0x66;
      uVar8 = 0x1cf;
      goto LAB_00121ceb;
    }
    if (type->definition->attributes == (coda_type_record *)0x0) {
      pcVar2 = coda_type_record_new(type->definition->format);
      type->definition->attributes = pcVar2;
      if (pcVar2 == (coda_type_record *)0x0) {
        return -1;
      }
    }
    pcVar3 = coda_mem_record_new(type->definition->attributes,(coda_dynamic_type *)0x0);
    type->attributes = pcVar3;
    if (pcVar3 == (coda_mem_record *)0x0) {
      return -1;
    }
  }
  else {
    if (pcVar3->backend != coda_backend_memory) {
      pcVar7 = "cannot add attribute (%s:%u)";
      uVar8 = 0x1d7;
      goto LAB_00121c31;
    }
    if (type->definition->attributes != pcVar3->definition) {
      __assert_fail("type->definition->attributes == type->attributes->definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                    ,0x1da,
                    "int coda_cdf_variable_add_attribute(coda_cdf_variable *, const char *, coda_dynamic_type *, int)"
                   );
    }
  }
  pcVar3 = type->attributes;
  lVar4 = coda_hashtable_get_index_from_name(pcVar3->definition->real_name_hash_data,real_name);
  if (update_definition == 0) {
    if (lVar4 < 0) {
      pcVar7 = "type does not have an attribute with name \'%s\' (%s:%u)";
      iVar1 = -0x66;
      uVar8 = 0x205;
    }
    else if (pcVar3->field_type[lVar4] == (coda_dynamic_type *)0x0) {
      if (pcVar3->definition->field[lVar4]->type == attribute_type->definition) goto LAB_00121d2d;
      pcVar7 = "trying to add attribute \'%s\' of incompatible type (%s:%u)";
      iVar1 = -100;
      uVar8 = 0x211;
    }
    else {
      pcVar7 = "attribute \'%s\' is already set (%s:%u)";
      iVar1 = -100;
      uVar8 = 0x20b;
    }
LAB_00121ceb:
    coda_set_error(iVar1,pcVar7,real_name,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                   ,uVar8);
    return -1;
  }
  if ((lVar4 < 0) ||
     ((lVar4 < pcVar3->num_fields && (pcVar3->field_type[lVar4] != (coda_dynamic_type *)0x0)))) {
    iVar1 = coda_type_record_create_field(pcVar3->definition,real_name,attribute_type->definition);
    if (iVar1 != 0) {
      return -1;
    }
    lVar4 = pcVar3->definition->num_fields + -1;
  }
  lVar6 = pcVar3->definition->num_fields;
  if (pcVar3->num_fields < lVar6) {
    ppcVar5 = (coda_dynamic_type **)realloc(pcVar3->field_type,lVar6 << 3);
    if (ppcVar5 == (coda_dynamic_type **)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     pcVar3->definition->num_fields << 3,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-type.c"
                     ,500);
    }
    else {
      pcVar3->field_type = ppcVar5;
      pcVar2 = pcVar3->definition;
      for (lVar6 = pcVar3->num_fields; lVar6 < pcVar2->num_fields; lVar6 = lVar6 + 1) {
        pcVar3->field_type[lVar6] = (coda_dynamic_type *)0x0;
        pcVar2 = pcVar3->definition;
      }
      pcVar3->num_fields = pcVar2->num_fields;
    }
    if (ppcVar5 == (coda_dynamic_type **)0x0) {
      return -1;
    }
  }
LAB_00121d2d:
  pcVar3->field_type[lVar4] = attribute_type;
  return 0;
}

Assistant:

int coda_cdf_variable_add_attribute(coda_cdf_variable *type, const char *real_name, coda_dynamic_type *attribute_type,
                                    int update_definition)
{
    coda_mem_record *attributes;
    long index = -1;

    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (real_name == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "real_name argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (attribute_type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attribute_type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (type->attributes == NULL)
    {
        if (update_definition)
        {
            if (type->definition->attributes == NULL)
            {
                type->definition->attributes = coda_type_record_new(type->definition->format);
                if (type->definition->attributes == NULL)
                {
                    return -1;
                }
            }
            type->attributes = coda_mem_record_new(type->definition->attributes, NULL);
            if (type->attributes == NULL)
            {
                return -1;
            }
        }
        else
        {
            coda_set_error(CODA_ERROR_INVALID_NAME, "type does not have an attribute with name '%s' (%s:%u)", real_name,
                           __FILE__, __LINE__);
            return -1;
        }
    }
    else
    {
        if (type->attributes->backend != coda_backend_memory)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cannot add attribute (%s:%u)", __FILE__, __LINE__);
            return -1;
        }
        assert(type->definition->attributes == type->attributes->definition);
    }

    attributes = type->attributes;

    index = hashtable_get_index_from_name(attributes->definition->real_name_hash_data, real_name);
    if (update_definition)
    {
        if (index < 0 || (index < attributes->num_fields && attributes->field_type[index] != NULL))
        {
            if (coda_type_record_create_field(attributes->definition, real_name, attribute_type->definition) != 0)
            {
                return -1;
            }
            index = attributes->definition->num_fields - 1;
        }
        if (attributes->num_fields < attributes->definition->num_fields)
        {
            coda_dynamic_type **new_field_type;
            long i;

            new_field_type = realloc(attributes->field_type,
                                     attributes->definition->num_fields * sizeof(coda_dynamic_type *));
            if (new_field_type == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               attributes->definition->num_fields * sizeof(coda_dynamic_type *), __FILE__, __LINE__);

                return -1;
            }
            attributes->field_type = new_field_type;
            for (i = attributes->num_fields; i < attributes->definition->num_fields; i++)
            {
                attributes->field_type[i] = NULL;
            }
            attributes->num_fields = attributes->definition->num_fields;
        }
    }
    else
    {
        if (index < 0)
        {
            coda_set_error(CODA_ERROR_INVALID_NAME, "type does not have an attribute with name '%s' (%s:%u)", real_name,
                           __FILE__, __LINE__);
            return -1;
        }
        if (attributes->field_type[index] != NULL)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attribute '%s' is already set (%s:%u)", real_name, __FILE__,
                           __LINE__);
            return -1;
        }
        if (attributes->definition->field[index]->type != attribute_type->definition)
        {
            coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "trying to add attribute '%s' of incompatible type (%s:%u)",
                           real_name, __FILE__, __LINE__);
            return -1;
        }
    }
    attributes->field_type[index] = attribute_type;

    return 0;
}